

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O3

float distance_point_to_line3(line3_t l,vec3_t pt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = l.direction.x;
  fVar3 = l.direction.y;
  fVar1 = ((pt.z - l.p.z) * l.direction.z + (pt.x - l.p.x) * fVar2 + (pt.y - l.p.y) * fVar3) /
          (l.direction.z * l.direction.z + fVar2 * fVar2 + fVar3 * fVar3);
  fVar2 = (fVar2 * fVar1 + l.p.x) - pt.x;
  fVar3 = (fVar3 * fVar1 + l.p.y) - pt.y;
  fVar1 = (fVar1 * l.direction.z + l.p.z) - pt.z;
  return SQRT(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3);
}

Assistant:

vec3_t
closest_point_on_line3(line3_t l, vec3_t pt) {
    vec3_t  pt_dir  = vec3_sub(pt, l.p);

    float   d_lp    = vec3_dot(l.direction, pt_dir);
    float   d_dd    = vec3_dot(l.direction, l.direction);

    float   t   = d_lp / d_dd;
    return vec3_add(l.p, vec3_mulf(l.direction, t));
}